

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O3

RotationY<std::complex<double>_> *
qclab::qgates::operator*
          (RotationY<std::complex<double>_> *__return_storage_ptr__,
          RotationY<std::complex<double>_> *lhs,RotationY<std::complex<double>_> *rhs)

{
  double dVar1;
  angle_type aVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  
  iVar8 = (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
          qubit_;
  iVar7 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar8 != iVar7) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                  ,0xb1,"RotationY<T> qclab::qgates::operator*(RotationY<T>, const RotationY<T> &)")
    ;
  }
  iVar8 = (*(lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(lhs);
  iVar7 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar8 == iVar7) {
    dVar4 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar5 = (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    dVar6 = (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    dVar1 = (rhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    dVar3 = dVar4 * dVar6 + dVar5 * dVar1;
    aVar2.sin_._0_4_ = SUB84(dVar3,0);
    aVar2.cos_ = dVar4 * dVar5 + -dVar6 * dVar1;
    aVar2.sin_._4_4_ = (int)((ulong)dVar3 >> 0x20);
    (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_ = aVar2;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.qubit_ =
         (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
         qubit_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.field_0xc =
         (lhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
         field_0xc;
    dVar1 = (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ =
         (lhs->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar1;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<double>_>).
    super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004ea318;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xa2,
                "RotationY<T> &qclab::qgates::RotationY<std::complex<double>>::operator*=(const RotationY<T> &) [T = std::complex<double>]"
               );
}

Assistant:

RotationY< T > operator*( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }